

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int ARGBMultiply(uint8_t *src_argb0,int src_stride_argb0,uint8_t *src_argb1,int src_stride_argb1,
                uint8_t *dst_argb,int dst_stride_argb,int width,int height)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  code *pcVar4;
  code *pcVar5;
  
  iVar2 = -1;
  if (height != 0 &&
      (0 < width &&
      (dst_argb != (uint8_t *)0x0 && (src_argb1 != (uint8_t *)0x0 && src_argb0 != (uint8_t *)0x0))))
  {
    iVar2 = height;
    if (height < 0) {
      iVar2 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    iVar1 = width * 4;
    if ((iVar1 == src_stride_argb1 && iVar1 == src_stride_argb0) && dst_stride_argb == iVar1) {
      width = iVar2 * width;
      src_stride_argb0 = 0;
      src_stride_argb1 = 0;
      dst_stride_argb = 0;
      iVar2 = 1;
    }
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((width & 3U) == 0) {
      pcVar4 = ARGBMultiplyRow_SSE2;
    }
    else {
      pcVar4 = ARGBMultiplyRow_Any_SSE2;
    }
    if ((uVar3 & 0x20) == 0) {
      pcVar4 = ARGBMultiplyRow_C;
    }
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar5 = ARGBMultiplyRow_AVX2;
    }
    else {
      pcVar5 = ARGBMultiplyRow_Any_AVX2;
    }
    if ((uVar3 >> 10 & 1) == 0) {
      pcVar5 = pcVar4;
    }
    do {
      (*pcVar5)(src_argb0,src_argb1,dst_argb,width);
      src_argb0 = src_argb0 + src_stride_argb0;
      src_argb1 = src_argb1 + src_stride_argb1;
      dst_argb = dst_argb + dst_stride_argb;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

LIBYUV_API
int ARGBMultiply(const uint8_t* src_argb0,
                 int src_stride_argb0,
                 const uint8_t* src_argb1,
                 int src_stride_argb1,
                 uint8_t* dst_argb,
                 int dst_stride_argb,
                 int width,
                 int height) {
  int y;
  void (*ARGBMultiplyRow)(const uint8_t* src0, const uint8_t* src1,
                          uint8_t* dst, int width) = ARGBMultiplyRow_C;
  if (!src_argb0 || !src_argb1 || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb0 == width * 4 && src_stride_argb1 == width * 4 &&
      dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb0 = src_stride_argb1 = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBMULTIPLYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBMultiplyRow = ARGBMultiplyRow_Any_SSE2;
    if (IS_ALIGNED(width, 4)) {
      ARGBMultiplyRow = ARGBMultiplyRow_SSE2;
    }
  }
#endif
#if defined(HAS_ARGBMULTIPLYROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBMultiplyRow = ARGBMultiplyRow_Any_AVX2;
    if (IS_ALIGNED(width, 8)) {
      ARGBMultiplyRow = ARGBMultiplyRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBMULTIPLYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBMultiplyRow = ARGBMultiplyRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBMultiplyRow = ARGBMultiplyRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBMULTIPLYROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBMultiplyRow = ARGBMultiplyRow_Any_MMI;
    if (IS_ALIGNED(width, 2)) {
      ARGBMultiplyRow = ARGBMultiplyRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBMULTIPLYROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBMultiplyRow = ARGBMultiplyRow_Any_MSA;
    if (IS_ALIGNED(width, 4)) {
      ARGBMultiplyRow = ARGBMultiplyRow_MSA;
    }
  }
#endif

  // Multiply plane
  for (y = 0; y < height; ++y) {
    ARGBMultiplyRow(src_argb0, src_argb1, dst_argb, width);
    src_argb0 += src_stride_argb0;
    src_argb1 += src_stride_argb1;
    dst_argb += dst_stride_argb;
  }
  return 0;
}